

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O0

SUNDlsMat SUNDlsMat_NewDenseMat(sunindextype M,sunindextype N)

{
  realtype *prVar1;
  realtype **pprVar2;
  int in_ESI;
  int in_EDI;
  sunindextype j;
  SUNDlsMat A;
  int local_1c;
  SUNDlsMat local_8;
  
  if ((in_EDI < 1) || (in_ESI < 1)) {
    local_8 = (SUNDlsMat)0x0;
  }
  else {
    local_8 = (SUNDlsMat)malloc(0x38);
    if (local_8 == (SUNDlsMat)0x0) {
      local_8 = (SUNDlsMat)0x0;
    }
    else {
      prVar1 = (realtype *)malloc((long)(in_EDI * in_ESI) << 3);
      local_8->data = prVar1;
      if (local_8->data == (realtype *)0x0) {
        free(local_8);
        local_8 = (SUNDlsMat)0x0;
      }
      else {
        pprVar2 = (realtype **)malloc((long)in_ESI << 3);
        local_8->cols = pprVar2;
        if (local_8->cols == (realtype **)0x0) {
          free(local_8->data);
          local_8->data = (realtype *)0x0;
          free(local_8);
          local_8 = (SUNDlsMat)0x0;
        }
        else {
          for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
            local_8->cols[local_1c] = local_8->data + local_1c * in_EDI;
          }
          local_8->M = in_EDI;
          local_8->N = in_ESI;
          local_8->ldim = in_EDI;
          local_8->ldata = in_EDI * in_ESI;
          local_8->type = 1;
        }
      }
    }
  }
  return local_8;
}

Assistant:

SUNDlsMat SUNDlsMat_NewDenseMat(sunindextype M, sunindextype N)
{
  SUNDlsMat A;
  sunindextype j;

  if ( (M <= 0) || (N <= 0) ) return(NULL);

  A = NULL;
  A = (SUNDlsMat) malloc(sizeof *A);
  if (A==NULL) return (NULL);

  A->data = (realtype *) malloc(M * N * sizeof(realtype));
  if (A->data == NULL) {
    free(A); A = NULL;
    return(NULL);
  }
  A->cols = (realtype **) malloc(N * sizeof(realtype *));
  if (A->cols == NULL) {
    free(A->data); A->data = NULL;
    free(A); A = NULL;
    return(NULL);
  }

  for (j=0; j < N; j++) A->cols[j] = A->data + j * M;

  A->M = M;
  A->N = N;
  A->ldim = M;
  A->ldata = M*N;

  A->type = SUNDIALS_DENSE;

  return(A);
}